

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::gestureTargetsAtHotSpots
          (QGraphicsScenePrivate *this,QSet<QGesture_*> *gestures,GestureFlag flag,
          QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *targets,QSet<QGraphicsObject_*> *itemsSet,
          QSet<QGesture_*> *normal,QSet<QGesture_*> *conflicts)

{
  bool bVar1;
  Int IVar2;
  QGesture **ppQVar3;
  qsizetype qVar4;
  const_reference ppQVar5;
  QGraphicsItemPrivate *this_00;
  QGraphicsItem *in_RCX;
  int in_EDX;
  QPointF *in_RSI;
  QPoint *in_RDI;
  QGraphicsItem **in_R8;
  long in_R9;
  long in_FS_OFFSET;
  long in_stack_00000008;
  QGraphicsItemPrivate *d;
  int j;
  QSet<QGesture_*> *__range1;
  const_iterator it;
  QGraphicsObject *itemobj;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> items;
  GestureType gestureType;
  QGesture *gesture;
  const_iterator __end1;
  const_iterator __begin1;
  QSet<QGesture_*> normalGestures;
  undefined4 in_stack_fffffffffffffed8;
  undefined2 in_stack_fffffffffffffedc;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  undefined1 uVar6;
  QGraphicsItem *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int iVar7;
  undefined4 in_stack_ffffffffffffff20;
  QPoint *screenPos;
  QGraphicsScenePrivate *in_stack_ffffffffffffff38;
  QFlagsStorageHelper<Qt::GestureFlag,_4> local_84;
  const_iterator local_80;
  const_iterator local_78;
  QGraphicsObject *local_70;
  QGraphicsItem *local_68;
  QList<QGraphicsItem_*> local_58;
  GestureType local_3c;
  QGesture *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QSet<QGesture_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
  screenPos = in_RDI;
  QSet<QGesture_*>::QSet((QSet<QGesture_*> *)0x9da767);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QGesture_*>::begin
            ((QSet<QGesture_*> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QGesture_*>::end
            ((QSet<QGesture_*> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  do {
    bVar1 = QSet<QGesture_*>::const_iterator::operator!=
                      ((const_iterator *)in_stack_fffffffffffffee0,
                       (const_iterator *)
                       CONCAT17(in_stack_fffffffffffffedf,
                                CONCAT16(in_stack_fffffffffffffede,
                                         CONCAT24(in_stack_fffffffffffffedc,
                                                  in_stack_fffffffffffffed8))));
    if (!bVar1) {
      if (in_R9 != 0) {
        QSet<QGesture_*>::operator=
                  ((QSet<QGesture_*> *)in_stack_fffffffffffffee0,
                   (QSet<QGesture_*> *)
                   CONCAT17(in_stack_fffffffffffffedf,
                            CONCAT16(in_stack_fffffffffffffede,
                                     CONCAT24(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)))
                  );
      }
      QSet<QGesture_*>::~QSet((QSet<QGesture_*> *)0x9dab44);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    ppQVar3 = QSet<QGesture_*>::const_iterator::operator*((const_iterator *)0x9da80b);
    local_38 = *ppQVar3;
    bVar1 = QGesture::hasHotSpot((QGesture *)0x9da823);
    if (bVar1) {
      local_3c = QGesture::gestureType((QGesture *)0x9da839);
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffee0);
      QGesture::d_func((QGesture *)0x9da887);
      itemsAtPosition(in_stack_ffffffffffffff38,screenPos,in_RSI,
                      (QWidget *)CONCAT44(in_EDX,in_stack_ffffffffffffff20));
      iVar7 = 0;
      while( true ) {
        in_stack_fffffffffffffee0 = (QGraphicsItem *)(long)iVar7;
        qVar4 = QList<QGraphicsItem_*>::size(&local_58);
        if (qVar4 <= (long)in_stack_fffffffffffffee0) break;
        ppQVar5 = QList<QGraphicsItem_*>::at
                            ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffee0,
                             CONCAT17(in_stack_fffffffffffffedf,
                                      CONCAT16(in_stack_fffffffffffffede,
                                               CONCAT24(in_stack_fffffffffffffedc,
                                                        in_stack_fffffffffffffed8))));
        local_68 = *ppQVar5;
        QGraphicsItem::isBlockedByModalPanel(in_RCX,in_R8);
        local_70 = QGraphicsItem::toGraphicsObject(in_stack_fffffffffffffee0);
        if (local_70 != (QGraphicsObject *)0x0) {
          this_00 = QGraphicsItem::d_func((QGraphicsItem *)0x9da943);
          local_78._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
          local_78._M_node =
               (_Base_ptr)
               QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::constFind
                         ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                          CONCAT17(in_stack_fffffffffffffedf,
                                   CONCAT16(in_stack_fffffffffffffede,
                                            CONCAT24(in_stack_fffffffffffffedc,
                                                     in_stack_fffffffffffffed8))),
                          (GestureType *)0x9da970);
          local_80._M_node =
               (_Base_ptr)
               QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::constEnd
                         ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                          CONCAT17(in_stack_fffffffffffffedf,
                                   CONCAT16(in_stack_fffffffffffffede,
                                            CONCAT24(in_stack_fffffffffffffedc,
                                                     in_stack_fffffffffffffed8))));
          bVar1 = ::operator!=((const_iterator *)in_stack_fffffffffffffee0,
                               (const_iterator *)
                               CONCAT17(in_stack_fffffffffffffedf,
                                        CONCAT16(in_stack_fffffffffffffede,
                                                 CONCAT24(in_stack_fffffffffffffedc,
                                                          in_stack_fffffffffffffed8))));
          uVar6 = false;
          in_stack_fffffffffffffedf = uVar6;
          if ((bVar1) &&
             (in_stack_fffffffffffffede = true,
             in_stack_fffffffffffffedf = in_stack_fffffffffffffede, in_EDX != 0)) {
            QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::value
                      ((const_iterator *)0x9da9cf);
            local_84.super_QFlagsStorage<Qt::GestureFlag>.i =
                 (QFlagsStorage<Qt::GestureFlag>)
                 QFlags<Qt::GestureFlag>::operator&
                           ((QFlags<Qt::GestureFlag> *)in_stack_fffffffffffffee0,
                            CONCAT13(uVar6,CONCAT12(in_stack_fffffffffffffede,
                                                    in_stack_fffffffffffffedc)));
            IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_84);
            in_stack_fffffffffffffede = IVar2 != 0;
            in_stack_fffffffffffffedf = in_stack_fffffffffffffede;
          }
          if ((bool)in_stack_fffffffffffffedf != false) {
            bVar1 = QSet<QGesture_*>::contains
                              ((QSet<QGesture_*> *)in_stack_fffffffffffffee0,
                               (QGesture **)
                               CONCAT17(in_stack_fffffffffffffedf,
                                        CONCAT16(in_stack_fffffffffffffede,
                                                 CONCAT24(in_stack_fffffffffffffedc,
                                                          in_stack_fffffffffffffed8))));
            if (bVar1) {
              QSet<QGesture_*>::remove(&local_10,(char *)&local_38);
              if (in_stack_00000008 != 0) {
                QSet<QGesture_*>::insert
                          ((QSet<QGesture_*> *)CONCAT44(iVar7,in_stack_fffffffffffffef8),
                           (QGesture **)this_00);
              }
            }
            else {
              QSet<QGesture_*>::insert
                        ((QSet<QGesture_*> *)CONCAT44(iVar7,in_stack_fffffffffffffef8),
                         (QGesture **)this_00);
            }
            if (in_RCX != (QGraphicsItem *)0x0) {
              QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::operator[]
                        ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)this_00,
                         (QGraphicsObject **)in_RDI);
              QSet<QGesture_*>::insert
                        ((QSet<QGesture_*> *)CONCAT44(iVar7,in_stack_fffffffffffffef8),
                         (QGesture **)this_00);
            }
            if (in_R8 != (QGraphicsItem **)0x0) {
              QSet<QGraphicsObject_*>::insert
                        ((QSet<QGraphicsObject_*> *)CONCAT44(iVar7,in_stack_fffffffffffffef8),
                         (QGraphicsObject **)this_00);
            }
          }
        }
        bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9daae4);
        if (bVar1) break;
        iVar7 = iVar7 + 1;
      }
      QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9dab0b);
    }
    QSet<QGesture_*>::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffee0);
  } while( true );
}

Assistant:

void QGraphicsScenePrivate::gestureTargetsAtHotSpots(const QSet<QGesture *> &gestures,
                                              Qt::GestureFlag flag,
                                              QHash<QGraphicsObject *, QSet<QGesture *> > *targets,
                                              QSet<QGraphicsObject *> *itemsSet,
                                              QSet<QGesture *> *normal,
                                              QSet<QGesture *> *conflicts)
{
    QSet<QGesture *> normalGestures; // that are not in conflicted state.
    for (QGesture *gesture : gestures) {
        if (!gesture->hasHotSpot())
            continue;
        const Qt::GestureType gestureType = gesture->gestureType();
        const QList<QGraphicsItem *> items = itemsAtPosition(QPoint(), gesture->d_func()->sceneHotSpot, nullptr);
        for (int j = 0; j < items.size(); ++j) {
            QGraphicsItem *item = items.at(j);

            // Check if the item is blocked by a modal panel and use it as
            // a target instead of this item.
            (void) item->isBlockedByModalPanel(&item);

            if (QGraphicsObject *itemobj = item->toGraphicsObject()) {
                QGraphicsItemPrivate *d = item->QGraphicsItem::d_func();
                QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator it =
                        d->gestureContext.constFind(gestureType);
                if (it != d->gestureContext.constEnd() && (!flag || (it.value() & flag))) {
                    if (normalGestures.contains(gesture)) {
                        normalGestures.remove(gesture);
                        if (conflicts)
                            conflicts->insert(gesture);
                    } else {
                        normalGestures.insert(gesture);
                    }
                    if (targets)
                        (*targets)[itemobj].insert(gesture);
                    if (itemsSet)
                        (*itemsSet).insert(itemobj);
                }
            }
            // Don't propagate through panels.
            if (item->isPanel())
                break;
        }
    }
    if (normal)
        *normal = normalGestures;
}